

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::EnumParseTester::_InternalSerialize
          (EnumParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  int iVar3;
  uint8_t *puVar4;
  const_pointer piVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  LogMessageFatal local_40;
  
  uVar8 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar8 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (1,(this->field_0)._impl_.optional_seq_small_0_lowfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_0_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_lowfield_;
    *puVar4 = '\x12';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_0_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_lowfield_;
    *puVar4 = '\x1a';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 2) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (4,(this->field_0)._impl_.optional_seq_small_1_lowfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_1_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_lowfield_;
    *puVar4 = '*';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_1_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_lowfield_;
    *puVar4 = '2';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((char)uVar8 < '\0') {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (7,(this->field_0)._impl_.optional_seq_large_lowfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_large_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_large_lowfield_;
    *puVar4 = 'B';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_large_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_large_lowfield_;
    *puVar4 = 'J';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 >> 8 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (10,(this->field_0)._impl_.optional_arbitrary_lowfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_arbitrary_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_lowfield_;
    *puVar4 = 'Z';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_arbitrary_lowfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_arbitrary_lowfield_;
    *puVar4 = 'b';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 4) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (99,(this->field_0)._impl_.other_field_,puVar4);
  }
  if ((uVar8 & 8) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x3e9,(this->field_0)._impl_.optional_seq_small_0_midfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_0_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_midfield_;
    puVar4[0] = 0xd2;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_0_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_midfield_;
    puVar4[0] = 0xda;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 0x40) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x3ec,(this->field_0)._impl_.optional_seq_small_1_midfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_1_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_midfield_;
    puVar4[0] = 0xea;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_1_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_midfield_;
    puVar4[0] = 0xf2;
    puVar4[1] = '>';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 >> 9 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x3ef,(this->field_0)._impl_.optional_seq_large_midfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_large_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_large_midfield_;
    puVar4[0] = 0x82;
    puVar4[1] = '?';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_large_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_large_midfield_;
    puVar4[0] = 0x8a;
    puVar4[1] = '?';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 >> 10 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x3f2,(this->field_0)._impl_.optional_arbitrary_midfield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_arbitrary_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_midfield_;
    puVar4[0] = 0x9a;
    puVar4[1] = '?';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_arbitrary_midfield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_arbitrary_midfield_;
    puVar4[0] = 0xa2;
    puVar4[1] = '?';
    target = puVar4 + 3;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 0x10) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf4241,(this->field_0)._impl_.optional_seq_small_0_hifield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_0_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_hifield_;
    puVar4[0] = 0x92;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_0_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_hifield_;
    puVar4[0] = 0x9a;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 & 0x20) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf4244,(this->field_0)._impl_.optional_seq_small_1_hifield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_small_1_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_hifield_;
    puVar4[0] = 0xaa;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_small_1_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_hifield_;
    puVar4[0] = 0xb2;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 >> 0xb & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf4247,(this->field_0)._impl_.optional_seq_large_hifield_,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_seq_large_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_seq_large_hifield_;
    puVar4[0] = 0xc2;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar9 = (this->field_0)._impl_._packed_seq_large_hifield_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.packed_seq_large_hifield_;
    puVar4[0] = 0xca;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  if ((uVar8 >> 0xc & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf424a,(this->field_0)._impl_.optional_arbitrary_hifield_,puVar4);
  }
  uVar8 = (this->field_0)._impl_._repeated_arbitrary_hifield_cached_byte_size_.atom_;
  if (uVar8 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) goto LAB_009d91e3;
    pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_hifield_;
    puVar4[0] = 0xda;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  uVar8 = (this->field_0)._impl_._packed_arbitrary_hifield_cached_byte_size_.atom_;
  if (uVar8 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) {
LAB_009d91e3:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar1 = &(this->field_0)._impl_.packed_arbitrary_hifield_;
    puVar4[0] = 0xe2;
    puVar4[1] = 0xa4;
    puVar4[2] = 0xe8;
    puVar4[3] = '\x03';
    target = puVar4 + 5;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    piVar5 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar5 + iVar3;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar2);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_EnumParseTester_default_instance_,target,stream);
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) == 0) {
    return puVar4;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.EnumParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_optional_seq_small_0_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_lowfield = 2;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          2, this_._internal_repeated_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_lowfield = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_packed_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_lowfield = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_optional_seq_small_1_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_lowfield = 5;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          5, this_._internal_repeated_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_lowfield = 6 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          6, this_._internal_packed_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_lowfield = 7;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_optional_seq_large_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_lowfield = 8;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          8, this_._internal_repeated_seq_large_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_lowfield = 9 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_packed_seq_large_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_lowfield = 10;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        10, this_._internal_optional_arbitrary_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_lowfield = 11;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          11, this_._internal_repeated_arbitrary_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_lowfield = 12 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          12, this_._internal_packed_arbitrary_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_midfield = 1001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1001, this_._internal_optional_seq_small_0_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_midfield = 1002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1002, this_._internal_repeated_seq_small_0_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_midfield = 1003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1003, this_._internal_packed_seq_small_0_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_midfield = 1004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1004, this_._internal_optional_seq_small_1_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_midfield = 1005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1005, this_._internal_repeated_seq_small_1_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_midfield = 1006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1006, this_._internal_packed_seq_small_1_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_midfield = 1007;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1007, this_._internal_optional_seq_large_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_midfield = 1008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1008, this_._internal_repeated_seq_large_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_midfield = 1009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1009, this_._internal_packed_seq_large_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_midfield = 1010;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1010, this_._internal_optional_arbitrary_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_midfield = 1011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1011, this_._internal_repeated_arbitrary_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_midfield = 1012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1012, this_._internal_packed_arbitrary_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_hifield = 1000001;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000001, this_._internal_optional_seq_small_0_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_hifield = 1000002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000002, this_._internal_repeated_seq_small_0_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_hifield = 1000003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000003, this_._internal_packed_seq_small_0_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_hifield = 1000004;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000004, this_._internal_optional_seq_small_1_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_hifield = 1000005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000005, this_._internal_repeated_seq_small_1_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_hifield = 1000006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000006, this_._internal_packed_seq_small_1_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_hifield = 1000007;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000007, this_._internal_optional_seq_large_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_hifield = 1000008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000008, this_._internal_repeated_seq_large_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_hifield = 1000009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000009, this_._internal_packed_seq_large_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_hifield = 1000010;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000010, this_._internal_optional_arbitrary_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_hifield = 1000011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000011, this_._internal_repeated_arbitrary_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_hifield = 1000012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000012, this_._internal_packed_arbitrary_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.EnumParseTester)
  return target;
}